

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs,uchar *p,size_t data_len)

{
  int iVar1;
  uint local_58;
  uint local_54;
  uint32_t mtime;
  uint32_t atime;
  uint32_t permissions;
  uint32_t gid;
  uint32_t uid;
  uint32_t flags;
  string_buf buf;
  size_t data_len_local;
  uchar *p_local;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  
  gid = 0;
  _uid = p;
  buf.data = p;
  buf.dataptr = (uchar *)data_len;
  buf.len = data_len;
  iVar1 = _libssh2_get_u32((string_buf *)&uid,&gid);
  if (iVar1 == 0) {
    attrs->flags = (ulong)gid;
    if (((attrs->flags & 1) == 0) ||
       (iVar1 = _libssh2_get_u64((string_buf *)&uid,&attrs->filesize), iVar1 == 0)) {
      if ((attrs->flags & 2) != 0) {
        permissions = 0;
        atime = 0;
        iVar1 = _libssh2_get_u32((string_buf *)&uid,&permissions);
        if ((iVar1 != 0) || (iVar1 = _libssh2_get_u32((string_buf *)&uid,&atime), iVar1 != 0)) {
          return -0x26;
        }
        attrs->uid = (ulong)permissions;
        attrs->gid = (ulong)atime;
      }
      if ((attrs->flags & 4) != 0) {
        iVar1 = _libssh2_get_u32((string_buf *)&uid,&mtime);
        if (iVar1 != 0) {
          return -0x26;
        }
        attrs->permissions = (ulong)mtime;
      }
      if ((attrs->flags & 8) != 0) {
        iVar1 = _libssh2_get_u32((string_buf *)&uid,&local_54);
        if ((iVar1 != 0) || (iVar1 = _libssh2_get_u32((string_buf *)&uid,&local_58), iVar1 != 0)) {
          return -0x26;
        }
        attrs->atime = (ulong)local_54;
        attrs->mtime = (ulong)local_58;
      }
      attrs_local._4_4_ = (int)buf.data - (int)_uid;
    }
    else {
      attrs_local._4_4_ = -0x26;
    }
  }
  else {
    attrs_local._4_4_ = -0x26;
  }
  return attrs_local._4_4_;
}

Assistant:

static int
sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs, const unsigned char *p,
              size_t data_len)
{
    struct string_buf buf;
    uint32_t flags = 0;
    buf.data = (unsigned char *)p;
    buf.dataptr = buf.data;
    buf.len = data_len;

    if(_libssh2_get_u32(&buf, &flags) != 0) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }
    attrs->flags = flags;

    if(attrs->flags & LIBSSH2_SFTP_ATTR_SIZE) {
        if(_libssh2_get_u64(&buf, &(attrs->filesize)) != 0) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_UIDGID) {
        uint32_t uid = 0;
        uint32_t gid = 0;
        if(_libssh2_get_u32(&buf, &uid) != 0 ||
           _libssh2_get_u32(&buf, &gid) != 0) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->uid = uid;
        attrs->gid = gid;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
        uint32_t permissions;
        if(_libssh2_get_u32(&buf, &permissions) != 0) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->permissions = permissions;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_ACMODTIME) {
        uint32_t atime;
        uint32_t mtime;
        if(_libssh2_get_u32(&buf, &atime) != 0 ||
           _libssh2_get_u32(&buf, &mtime) != 0) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->atime = atime;
        attrs->mtime = mtime;
    }

    return (buf.dataptr - buf.data);
}